

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aiman.h
# Opt level: O2

void server::aiman::calcteams(vector<teamscore> *teams)

{
  int *piVar1;
  long lVar2;
  teamscore *ptVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  teamscore local_40;
  
  lVar9 = 0;
  iVar7 = DAT_00191854;
  do {
    if (iVar7 <= lVar9) {
      vector<teamscore>::sort<bool(*)(teamscore_const&,teamscore_const&)>
                (teams,teamscore::compare,0,-1);
      if (teams->ulen < 2) {
        for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 8) {
          iVar7 = vector<teamscore>::htfind<char_const*>
                            (teams,(char **)((long)autoteam::teamnames + lVar9));
          if (iVar7 < 0) {
            local_40.team = *(char **)((long)autoteam::teamnames + lVar9);
            local_40.score = 0;
            vector<teamscore>::add(teams,&local_40);
          }
        }
      }
      return;
    }
    lVar2 = *(long *)(clients + lVar9 * 8);
    if ((*(int *)(lVar2 + 0x3c4) != 5) && (*(char *)(lVar2 + 0x124) != '\0')) {
      uVar4 = teams->ulen;
      if (teams->ulen < 1) {
        uVar4 = 0;
      }
      ptVar3 = teams->buf;
      lVar5 = 0;
      do {
        lVar8 = lVar5;
        if ((ulong)uVar4 * 0x10 + 0x10 == lVar8 + 0x10) {
          local_40.score = 1;
          local_40.team = (char *)(lVar2 + 0x124);
          vector<teamscore>::add(teams,&local_40);
          iVar7 = DAT_00191854;
          goto LAB_001400c9;
        }
        iVar6 = strcmp(*(char **)((long)&ptVar3->team + lVar8),(char *)(lVar2 + 0x124));
        lVar5 = lVar8 + 0x10;
      } while (iVar6 != 0);
      piVar1 = (int *)((long)&ptVar3->score + lVar8);
      *piVar1 = *piVar1 + 1;
    }
LAB_001400c9:
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

void calcteams(vector<teamscore> &teams)
    {
        static const char * const defaults[2] = { "good", "evil" };
        loopv(clients)
        {
            clientinfo *ci = clients[i];
            if(ci->state.state==CS_SPECTATOR || !ci->team[0]) continue;
            teamscore *t = NULL;
            loopvj(teams) if(!strcmp(teams[j].team, ci->team)) { t = &teams[j]; break; }
            if(t) t->score++;
            else teams.add(teamscore(ci->team, 1));
        }
        teams.sort(teamscore::compare);
        if(teams.length() < int(sizeof(defaults)/sizeof(defaults[0])))
        {
            loopi(sizeof(defaults)/sizeof(defaults[0])) if(teams.htfind(defaults[i]) < 0) teams.add(teamscore(defaults[i], 0));
        }
    }